

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psemaphore-posix.c
# Opt level: O3

pboolean p_semaphore_acquire(PSemaphore *sem,PError **error)

{
  int iVar1;
  pint pVar2;
  PErrorIPC code;
  
  if (sem == (PSemaphore *)0x0) {
    p_semaphore_acquire_cold_1();
  }
  else {
    do {
      iVar1 = sem_wait((sem_t *)sem->sem_hdl);
      if (iVar1 == 0) {
        return 1;
      }
    } while ((iVar1 == -1) && (pVar2 = p_error_get_last_system(), pVar2 == 4));
    code = p_error_get_last_ipc();
    pVar2 = p_error_get_last_system();
    p_error_set_error_p(error,code,pVar2,"Failed to call sem_wait() on semaphore");
  }
  return 0;
}

Assistant:

P_LIB_API pboolean
p_semaphore_acquire (PSemaphore	*sem,
		     PError	**error)
{
	pboolean	ret;
	pint		res;

	if (P_UNLIKELY (sem == NULL)) {
		p_error_set_error_p (error,
				     (pint) P_ERROR_IPC_INVALID_ARGUMENT,
				     0,
				     "Invalid input argument");
		return FALSE;
	}

	while ((res = sem_wait (sem->sem_hdl)) == -1 && p_error_get_last_system () == EINTR)
		;

	ret = (res == 0);

	if (P_UNLIKELY (ret == FALSE))
		p_error_set_error_p (error,
				     (pint) p_error_get_last_ipc (),
				     p_error_get_last_system (),
				     "Failed to call sem_wait() on semaphore");

	return ret;
}